

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlParserInputPtr pxVar2;
  xmlDocPtr doc;
  xmlChar *pxVar3;
  _xmlSAXHandler *p_Var4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  uint uVar7;
  xmlChar *value;
  int *piVar8;
  _xmlNode *p_Var9;
  int iVar10;
  int iVar11;
  int iVar12;
  int tlen;
  xmlChar *URI;
  xmlChar *prefix;
  xmlParserNodeInfo node_info;
  int local_74;
  xmlChar *local_70;
  xmlChar *local_68;
  _xmlNode *local_60;
  xmlParserNodeInfo local_58;
  
  local_68 = (xmlChar *)0x0;
  local_70 = (xmlChar *)0x0;
  local_74 = 0;
  iVar12 = ctxt->nsNr;
  if ((xmlParserMaxDepth < (uint)ctxt->nameNr) && ((ctxt->options & 0x80000) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser(ctxt);
    iVar10 = -1;
  }
  else {
    if (ctxt->record_info != 0) {
      pxVar2 = ctxt->input;
      local_58.begin_pos = (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
      local_58.begin_line = (unsigned_long)pxVar2->line;
    }
    if (ctxt->spaceNr == 0) {
      iVar11 = -1;
    }
    else {
      iVar11 = -1;
      if (*ctxt->space != -2) {
        iVar11 = *ctxt->space;
      }
    }
    spacePush(ctxt,iVar11);
    iVar11 = ctxt->input->line;
    if (ctxt->sax2 == 0) {
      value = xmlParseStartTag(ctxt);
    }
    else {
      value = xmlParseStartTag2(ctxt,&local_68,&local_70,&local_74);
    }
    pxVar6 = local_68;
    pxVar5 = local_70;
    iVar10 = -1;
    if (ctxt->instate != XML_PARSER_EOF) {
      if (value == (xmlChar *)0x0) {
        iVar12 = ctxt->spaceNr;
        if (0 < (long)iVar12) {
          ctxt->spaceNr = iVar12 + -1;
          piVar1 = ctxt->spaceTab + (long)iVar12 + -2;
          piVar8 = ctxt->spaceTab;
          if (iVar12 != 1) {
            piVar8 = piVar1;
          }
          ctxt->space = piVar8;
          piVar1[1] = -1;
        }
      }
      else {
        nameNsPush(ctxt,value,local_68,local_70,iVar11,ctxt->nsNr - iVar12);
        p_Var9 = ctxt->node;
        if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
            (doc = ctxt->myDoc, p_Var9 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
           (p_Var9 == doc->children)) {
          local_60 = p_Var9;
          uVar7 = xmlValidateRoot(&ctxt->vctxt,doc);
          ctxt->valid = ctxt->valid & uVar7;
          p_Var9 = local_60;
        }
        pxVar2 = ctxt->input;
        pxVar3 = pxVar2->cur;
        if (*pxVar3 == '>') {
          pxVar2->col = pxVar2->col + 1;
          pxVar2->cur = pxVar3 + 1;
          iVar10 = 0;
          if (pxVar3[1] == '\0') {
            xmlParserInputGrow(pxVar2,0xfa);
            iVar10 = 0;
          }
        }
        else {
          if ((*pxVar3 == '/') && (pxVar3[1] == '>')) {
            pxVar2->cur = pxVar3 + 2;
            pxVar2->col = pxVar2->col + 2;
            if (pxVar3[2] == '\0') {
              xmlParserInputGrow(pxVar2,0xfa);
            }
            p_Var4 = ctxt->sax;
            if (ctxt->sax2 == 0) {
              if (((p_Var4 != (_xmlSAXHandler *)0x0) &&
                  (p_Var4->endElement != (endElementSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
                (*p_Var4->endElement)(ctxt->userData,value);
              }
            }
            else if (((p_Var4 != (_xmlSAXHandler *)0x0) &&
                     (p_Var4->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)
                    ) {
              (*p_Var4->endElementNs)(ctxt->userData,value,pxVar6,pxVar5);
            }
            namePop(ctxt);
            iVar11 = ctxt->spaceNr;
            if (0 < (long)iVar11) {
              ctxt->spaceNr = iVar11 + -1;
              piVar1 = ctxt->spaceTab + (long)iVar11 + -2;
              piVar8 = ctxt->spaceTab;
              if (iVar11 != 1) {
                piVar8 = piVar1;
              }
              ctxt->space = piVar8;
              piVar1[1] = -1;
            }
            iVar12 = ctxt->nsNr - iVar12;
            if (iVar12 != 0) {
              nsPop(ctxt,iVar12);
            }
            iVar10 = 1;
            if (p_Var9 == (_xmlNode *)0x0) {
              return 1;
            }
            if (ctxt->record_info == 0) {
              return 1;
            }
            pxVar2 = ctxt->input;
            local_58.end_pos =
                 (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
            iVar12 = pxVar2->line;
          }
          else {
            xmlFatalErrMsgStrIntStr
                      (ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",value
                       ,iVar11,(xmlChar *)0x0);
            nodePop(ctxt);
            namePop(ctxt);
            iVar11 = ctxt->spaceNr;
            if (0 < (long)iVar11) {
              ctxt->spaceNr = iVar11 + -1;
              piVar1 = ctxt->spaceTab + (long)iVar11 + -2;
              piVar8 = ctxt->spaceTab;
              if (iVar11 != 1) {
                piVar8 = piVar1;
              }
              ctxt->space = piVar8;
              piVar1[1] = -1;
            }
            iVar12 = ctxt->nsNr - iVar12;
            if (iVar12 != 0) {
              nsPop(ctxt,iVar12);
            }
            if (p_Var9 == (_xmlNode *)0x0) {
              return -1;
            }
            if (ctxt->record_info == 0) {
              return -1;
            }
            pxVar2 = ctxt->input;
            local_58.end_pos =
                 (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
            iVar12 = pxVar2->line;
          }
          local_58.end_line = (unsigned_long)iVar12;
          local_58.node = p_Var9;
          xmlParserAddNodeInfo(ctxt,&local_58);
        }
      }
    }
  }
  return iVar10;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line, tlen = 0;
    xmlNodePtr ret;
    int nsNr = ctxt->nsNr;

    if (((unsigned int) ctxt->nameNr > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	return(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &tlen);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);
    if (name == NULL) {
	spacePop(ctxt);
        return(-1);
    }
    nameNsPush(ctxt, name, prefix, URI, line, ctxt->nsNr - nsNr);
    ret = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if ((RAW == '/') && (NXT(1) == '>')) {
        SKIP(2);
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(1);
    }
    if (RAW == '>') {
        NEXT1;
    } else {
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
		     "Couldn't find end of Start Tag %s line %d\n",
		                name, line, NULL);

	/*
	 * end of parsing of this node.
	 */
	nodePop(ctxt);
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);

	/*
	 * Capture end position and add node
	 */
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(-1);
    }

    return(0);
}